

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O2

int Aig_ManCountXors(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pNode;
  int i;
  int iVar2;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  iVar2 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pNode = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
      iVar1 = Aig_ObjIsMuxType(pNode);
      if (iVar1 != 0) {
        iVar1 = Aig_ObjRecognizeExor(pNode,&local_38,&local_40);
        iVar2 = (iVar2 + 1) - (uint)(iVar1 == 0);
      }
    }
  }
  return iVar2;
}

Assistant:

int Aig_ManCountXors( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFan0, * pFan1;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjIsMuxType(pObj) && Aig_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            Counter++;
    return Counter;

}